

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::push_back
          (array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *this,
          unsigned_long *item)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *in_RSI;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *in_RDI;
  size_t i;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> temp;
  size_t in_stack_00000188;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *in_stack_00000190;
  unsigned_long *in_stack_ffffffffffffff38;
  unsigned_long *in_stack_ffffffffffffff40;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *in_stack_ffffffffffffff50;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *in_stack_ffffffffffffff58;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *in_stack_ffffffffffffff60;
  size_t local_68;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> local_50;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *local_10;
  
  local_10 = in_RSI;
  sVar2 = max_size(in_RDI);
  iVar1 = (*(in_RDI->super_enumerable<unsigned_long>)._vptr_enumerable[8])();
  if (sVar2 == CONCAT44(extraout_var,iVar1)) {
    array(in_stack_ffffffffffffff50);
    (*(in_RDI->super_enumerable<unsigned_long>)._vptr_enumerable[8])();
    set_max_size(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
    (*(in_RDI->super_enumerable<unsigned_long>)._vptr_enumerable[8])();
    set_size(in_stack_00000190,in_stack_00000188);
    local_68 = 0;
    while( true ) {
      iVar1 = (*(in_RDI->super_enumerable<unsigned_long>)._vptr_enumerable[8])();
      if (CONCAT44(extraout_var_00,iVar1) <= local_68) break;
      in_stack_ffffffffffffff60 =
           (array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *)
           operator[](in_RDI,local_68);
      in_stack_ffffffffffffff58 =
           (array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *)
           operator[](&local_50,local_68);
      exchange<unsigned_long>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_68 = local_68 + 1;
    }
    sVar2 = size(&local_50);
    operator[](&local_50,sVar2 - 1);
    exchange<unsigned_long>((unsigned_long *)local_10,in_stack_ffffffffffffff38);
    swap(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ~array(local_10);
  }
  else {
    (*(in_RDI->super_enumerable<unsigned_long>)._vptr_enumerable[8])();
    set_size(in_stack_00000190,in_stack_00000188);
    iVar1 = (*(in_RDI->super_enumerable<unsigned_long>)._vptr_enumerable[8])();
    operator[](in_RDI,CONCAT44(extraout_var_01,iVar1) - 1);
    exchange<unsigned_long>(in_stack_ffffffffffffff40,(unsigned_long *)local_10);
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (size_t i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }